

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gil.h
# Opt level: O3

void __thiscall pybind11::gil_scoped_acquire::gil_scoped_acquire(gil_scoped_acquire *this)

{
  internals *piVar1;
  PyThreadState *pPVar2;
  PyThreadState *pPVar3;
  
  this->tstate = (PyThreadState *)0x0;
  this->release = true;
  this->active = true;
  piVar1 = detail::get_internals();
  pPVar2 = (PyThreadState *)PyThread_tss_get(piVar1->tstate);
  this->tstate = pPVar2;
  if (pPVar2 == (PyThreadState *)0x0) {
    pPVar2 = (PyThreadState *)PyGILState_GetThisThreadState();
    this->tstate = pPVar2;
    if (pPVar2 != (PyThreadState *)0x0) goto LAB_0024a3c2;
    pPVar2 = (PyThreadState *)PyThreadState_New(piVar1->istate);
    this->tstate = pPVar2;
    if (pPVar2 == (PyThreadState *)0x0) {
      pybind11_fail("scoped_acquire: could not create thread state!");
    }
    pPVar2->gilstate_counter = 0;
    PyThread_tss_set(piVar1->tstate,pPVar2);
    pPVar2 = this->tstate;
    if ((this->release & 1U) == 0) goto LAB_0024a3db;
  }
  else {
LAB_0024a3c2:
    pPVar3 = (PyThreadState *)_PyThreadState_UncheckedGet();
    pPVar2 = this->tstate;
    this->release = pPVar3 != pPVar2;
    if (pPVar3 == pPVar2) goto LAB_0024a3db;
  }
  PyEval_AcquireThread();
  pPVar2 = this->tstate;
LAB_0024a3db:
  pPVar2->gilstate_counter = pPVar2->gilstate_counter + 1;
  return;
}

Assistant:

PYBIND11_NOINLINE gil_scoped_acquire() {
        auto &internals = detail::get_internals();
        tstate = (PyThreadState *) PYBIND11_TLS_GET_VALUE(internals.tstate);

        if (!tstate) {
            /* Check if the GIL was acquired using the PyGILState_* API instead (e.g. if
               calling from a Python thread). Since we use a different key, this ensures
               we don't create a new thread state and deadlock in PyEval_AcquireThread
               below. Note we don't save this state with internals.tstate, since we don't
               create it we would fail to clear it (its reference count should be > 0). */
            tstate = PyGILState_GetThisThreadState();
        }

        if (!tstate) {
            tstate = PyThreadState_New(internals.istate);
            #if !defined(NDEBUG)
                if (!tstate)
                    pybind11_fail("scoped_acquire: could not create thread state!");
            #endif
            tstate->gilstate_counter = 0;
            PYBIND11_TLS_REPLACE_VALUE(internals.tstate, tstate);
        } else {
            release = detail::get_thread_state_unchecked() != tstate;
        }

        if (release) {
            PyEval_AcquireThread(tstate);
        }

        inc_ref();
    }